

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::VarintTest_TestWriteTwoElementStringVector_Test::
VarintTest_TestWriteTwoElementStringVector_Test
          (VarintTest_TestWriteTwoElementStringVector_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0026aa70;
  return;
}

Assistant:

TEST(VarintTest, TestWriteTwoElementStringVector)
{
    ByteBuffer buffer = ByteBuffer();
    std::vector<std::string> strings;
    strings.emplace_back("one");
    strings.emplace_back("two");
    Varint::WriteStringVector(buffer, strings);
    EXPECT_EQ("\002\004one\004two", buffer.ToString());
}